

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotations.cpp
# Opt level: O3

SubFrame * __thiscall ezc3d::DataNS::RotationNS::Rotations::subframe(Rotations *this,size_t idx)

{
  pointer pSVar1;
  out_of_range *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  ulong uVar5;
  undefined1 auVar6 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (this->_subframe).
           super__Vector_base<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->_subframe).
                 super__Vector_base<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
          -0x5555555555555555;
  if (idx <= uVar5 && uVar5 - idx != 0) {
    return pSVar1 + idx;
  }
  auVar6 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      idx);
  if (auVar6._8_4_ == 1) {
    __cxa_begin_catch(auVar6._0_8_);
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_d0,idx);
    std::operator+(&local_70,"Analogs::subframe method is trying to access the subframe ",&local_d0)
    ;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_f0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar3) {
      local_f0.field_2._M_allocated_capacity = *psVar3;
      local_f0.field_2._8_8_ = plVar2[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar3;
    }
    local_f0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string
              (&local_90,
               ((long)(this->_subframe).
                      super__Vector_base<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_subframe).
                      super__Vector_base<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    std::operator+(&local_50,&local_f0,&local_90);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_b0 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::out_of_range::out_of_range(this_00,(string *)&local_b0);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  _Unwind_Resume(auVar6._0_8_);
}

Assistant:

ezc3d::DataNS::RotationNS::SubFrame &
ezc3d::DataNS::RotationNS::Rotations::subframe(size_t idx) {
  try {
    return _subframe.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Analogs::subframe method is trying to access the subframe " +
        std::to_string(idx) + " while the maximum number of subframes is " +
        std::to_string(nbSubframes()) + ".");
  }
}